

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

UnknownFieldSet * __thiscall
google::protobuf::UnknownFieldSet::AddGroup(UnknownFieldSet *this,int number)

{
  pointer pUVar1;
  Arena *arena;
  UnknownFieldSet *pUVar2;
  
  pUVar1 = RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_);
  pUVar1->number_ = number;
  pUVar1->type_ = 4;
  arena = RepeatedField<google::protobuf::UnknownField>::GetArena(&this->fields_);
  pUVar2 = Arena::CreateArenaCompatible<google::protobuf::UnknownFieldSet>(arena);
  (pUVar1->data_).group = pUVar2;
  return pUVar2;
}

Assistant:

UnknownFieldSet* UnknownFieldSet::AddGroup(int number) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_GROUP);
  field.data_.group = Arena::Create<UnknownFieldSet>(arena());
  return field.data_.group;
}